

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointerAnalysis.h
# Opt level: O0

bool __thiscall
dg::DGLLVMPointerAnalysisImpl<dg::pta::PointerAnalysisFS>::handleFork
          (DGLLVMPointerAnalysisImpl<dg::pta::PointerAnalysisFS> *this,PSNode *forkNode,
          PSNode *called)

{
  PSNodeFork *in_RDX;
  long in_RDI;
  PSNodeFork *fork;
  PSNode *in_stack_ffffffffffffffe0;
  
  pta::PSNodeFork::get(in_stack_ffffffffffffffe0);
  dg::pta::LLVMPointerGraphBuilder::addFunctionToFork(*(PSNode **)(in_RDI + 0xa0),in_RDX);
  return true;
}

Assistant:

bool handleFork(PSNode *forkNode, PSNode *called) override {
        using namespace llvm;
        using namespace dg::pta;

        assert(called->getType() == PSNodeType::FUNCTION &&
               "The called value is not a function");

        PSNodeFork *fork = PSNodeFork::get(forkNode);
        builder->addFunctionToFork(called, fork);

#ifndef NDEBUG
        // check the graph after rebuilding, but do not check for connectivity,
        // because we can call a function that will disconnect the graph
        if (!builder->validateSubgraph(true)) {
            const llvm::Function *F = llvm::cast<llvm::Function>(
                    called->getUserData<llvm::Value>());
            llvm::errs() << "Pointer Subgraph is broken!\n";
            llvm::errs() << "This happend after building this function spawned "
                            "in a thread: "
                         << F->getName() << "\n";
            abort();
        }
#endif // NDEBUG

        return true;
    }